

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall fmt::v11::detail::bigint::remove_leading_zeros(bigint *this)

{
  int value;
  make_unsigned_t<int> mVar1;
  size_t sVar2;
  uint *puVar3;
  bool bVar4;
  int local_14;
  int num_bigits;
  bigint *this_local;
  
  sVar2 = buffer<unsigned_int>::size((buffer<unsigned_int> *)this);
  local_14 = (int)sVar2;
  do {
    value = local_14;
    local_14 = value + -1;
    bVar4 = false;
    if (0 < local_14) {
      puVar3 = buffer<unsigned_int>::operator[]<int>((buffer<unsigned_int> *)this,local_14);
      bVar4 = *puVar3 == 0;
    }
  } while (bVar4);
  mVar1 = to_unsigned<int>(value);
  basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::resize
            (&this->bigits_,(ulong)mVar1);
  return;
}

Assistant:

FMT_CONSTEXPR void remove_leading_zeros() {
    int num_bigits = static_cast<int>(bigits_.size()) - 1;
    while (num_bigits > 0 && bigits_[num_bigits] == 0) --num_bigits;
    bigits_.resize(to_unsigned(num_bigits + 1));
  }